

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O0

void __thiscall LiteScript::State::RemoveCallback(State *this)

{
  size_type sVar1;
  reference this_00;
  reference pvVar2;
  array<unsigned_int,_2UL> *cp;
  State *this_local;
  
  sVar1 = std::
          vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
          size(&this->call_lifo);
  if (sVar1 != 0) {
    this_00 = std::
              vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
              ::back(&this->call_lifo);
    pvVar2 = std::array<unsigned_int,_2UL>::operator[](this_00,0);
    this->instr_index = *pvVar2;
    pvVar2 = std::array<unsigned_int,_2UL>::operator[](this_00,1);
    this->line_num = *pvVar2;
    std::vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
    pop_back(&this->call_lifo);
  }
  return;
}

Assistant:

void LiteScript::State::RemoveCallback() {
    if (this->call_lifo.size() == 0)
        return;
    std::array<unsigned int, 2>& cp = this->call_lifo.back();
    this->instr_index = cp[0];
    this->line_num = cp[1];
    this->call_lifo.pop_back();
}